

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O3

char * __thiscall
sisl::body_centered_cubic<char>::operator()(body_centered_cubic<char> *this,int d0,...)

{
  _func_int **pp_Var1;
  int iVar2;
  char *pcVar3;
  undefined8 *puVar4;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_R9;
  va_list vl;
  
  this->__zero = '\0';
  pp_Var1 = (this->super_base_lattice<char>)._vptr_base_lattice;
  iVar2 = (*pp_Var1[0xf])(this,d0,(ulong)in_EDX,(ulong)in_ECX,pp_Var1,in_R9,0x3000000020,
                          &vl[0].overflow_arg_area);
  if ((char)iVar2 == '\0') {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "body_centered_cubic::operator() - given non lattice site!";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  pcVar3 = &this->__zero;
  if ((((-1 < d0) && (d0 <= this->_nx)) && (-1 < (int)(in_ECX | in_EDX))) &&
     (((int)in_EDX <= this->_ny && ((int)in_ECX <= this->_nz)))) {
    pcVar3 = array_n<char,_3,_std::allocator<char>_>::operator()
                       (&this->_array,(int)(d0 - (in_ECX & 1)) / 2,
                        (ulong)(uint)((int)(in_EDX - (in_ECX & 1)) / 2),(ulong)in_ECX);
  }
  return pcVar3;
}

Assistant:

virtual T& operator()(int d0, ...) {
            int _x = d0, _y = 0, _z = 0;
            int ax, ay, az;
            va_list vl;

            va_start(vl, d0);
            _y = va_arg(vl, int);
            _z = va_arg(vl, int);
            va_end(vl);
            __zero = 0;

            if(!is_lattice_site(_x, _y, _z)) throw "body_centered_cubic::operator() - given non lattice site!";
            if(!in_bound(_x, _y, _z))  return __zero;

            // Transform to 3d array index
            {
                int zmod = _z % 2;
                ax = (_x - zmod) / 2;
                ay = (_y - zmod) / 2;
                az = _z;
            }

            return _array(ax, ay, az);
        }